

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O3

bool __thiscall
adiak::value<std::array<float,3ul>>
          (adiak *this,string *name,array<float,_3UL> value,int category,string *subcategory)

{
  int iVar1;
  adiak_datatype_t *type;
  adiak_value_t *value_00;
  void *pvVar2;
  long lVar3;
  undefined4 in_register_00000014;
  bool bVar4;
  undefined8 local_38;
  float local_30;
  
  local_30 = value._M_elems[2];
  local_38 = value._M_elems._0_8_;
  type = internal::create_container_type<std::array<float,_3UL>_>::make_type();
  if (type == (adiak_datatype_t *)0x0) {
    bVar4 = false;
  }
  else {
    value_00 = (adiak_value_t *)malloc(8);
    pvVar2 = malloc(0x18);
    lVar3 = 0;
    do {
      *(double *)((long)pvVar2 + lVar3 * 2) = (double)*(float *)((long)&local_38 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0xc);
    value_00->v_ptr = pvVar2;
    type->num_elements = 3;
    iVar1 = adiak_raw_namevalue(*(char **)this,(int)name,
                                *(char **)CONCAT44(in_register_00000014,category),value_00,type);
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }